

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::refreshControls(CGUIScrollBar *this)

{
  long *plVar1;
  rect<int> rectangle;
  rect<int> rectangle_00;
  rect<int> rectangle_01;
  rect<int> rectangle_02;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int x;
  int iVar6;
  uint uVar7;
  long *plVar8;
  void *pvVar9;
  undefined8 uVar10;
  long *in_RDI;
  s32 h_1;
  s32 w_1;
  s32 w;
  s32 h;
  IGUISpriteBank *sprites;
  IGUISkin *skin;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  rect<int> *in_stack_fffffffffffffe50;
  rect<int> *this_00;
  long in_stack_fffffffffffffe70;
  rect<int> *in_stack_fffffffffffffe78;
  IGUIElement *in_stack_fffffffffffffe80;
  IGUIElement *this_01;
  long *in_stack_fffffffffffffe88;
  IGUIElement *in_stack_fffffffffffffe90;
  IGUIEnvironment *in_stack_fffffffffffffe98;
  CGUIButton *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  long local_20;
  SColor local_c [3];
  
  video::SColor::SColor(local_c,0xff,0xff,0xff,0xff);
  *(u32 *)(in_RDI + 0x30) = local_c[0].color;
  plVar8 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
  local_20 = 0;
  if (plVar8 != (long *)0x0) {
    local_20 = (**(code **)(*plVar8 + 0x40))();
    bVar2 = (**(code **)(*in_RDI + 0x90))();
    uVar10 = 0x15;
    if ((bVar2 & 1) != 0) {
      uVar10 = 0x12;
    }
    uVar3 = (**(code **)*plVar8)(plVar8,uVar10);
    *(undefined4 *)(in_RDI + 0x30) = uVar3;
  }
  if ((*(byte *)((long)in_RDI + 0x159) & 1) == 0) {
    x = core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
    iVar5 = x;
    iVar6 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
    iVar4 = x;
    if (iVar6 / 2 <= iVar5) {
      iVar4 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
      iVar4 = iVar4 / 2;
    }
    iVar6 = iVar4;
    if (in_RDI[0x27] == 0) {
      in_stack_fffffffffffffea0 = (CGUIButton *)operator_new(0x2a8);
      in_stack_fffffffffffffe98 = (IGUIEnvironment *)in_RDI[0x25];
      core::rect<int>::rect
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      rectangle_01.UpperLeftCorner.Y = iVar6;
      rectangle_01.UpperLeftCorner.X = in_stack_fffffffffffffea8;
      rectangle_01.LowerRightCorner.X = iVar5;
      rectangle_01.LowerRightCorner.Y = in_stack_fffffffffffffeb4;
      CGUIButton::CGUIButton
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (s32)((ulong)in_stack_fffffffffffffe88 >> 0x20),rectangle_01,
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      in_RDI[0x27] = (long)in_stack_fffffffffffffea0;
      (**(code **)(*(long *)in_RDI[0x27] + 0x88))();
      IGUIElement::setTabStop((IGUIElement *)in_RDI[0x27],false);
    }
    if (local_20 != 0) {
      (**(code **)(*(long *)in_RDI[0x27] + 0x188))((long *)in_RDI[0x27],local_20);
      in_stack_fffffffffffffe88 = (long *)in_RDI[0x27];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,5);
      (**(code **)(*in_stack_fffffffffffffe88 + 400))
                (in_stack_fffffffffffffe88,0,uVar3,(int)in_RDI[0x30],0);
      in_stack_fffffffffffffe90 = (IGUIElement *)in_RDI[0x27];
      uVar7 = (**(code **)(*plVar8 + 0x50))(plVar8,5);
      (*(in_stack_fffffffffffffe90->super_IEventReceiver)._vptr_IEventReceiver[0x32])
                (in_stack_fffffffffffffe90,1,(ulong)uVar7,(ulong)*(uint *)(in_RDI + 0x30),0);
    }
    this_01 = (IGUIElement *)in_RDI[0x27];
    core::rect<int>::rect
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
    IGUIElement::setRelativePosition(this_01,in_stack_fffffffffffffe78);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe78,
               (EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe70);
    if (in_RDI[0x28] == 0) {
      in_stack_fffffffffffffe78 = (rect<int> *)operator_new(0x2a8);
      in_stack_fffffffffffffe70 = in_RDI[0x25];
      core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
      core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
      core::rect<int>::rect
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      rectangle_02.UpperLeftCorner.Y = iVar6;
      rectangle_02.UpperLeftCorner.X = in_stack_fffffffffffffea8;
      rectangle_02.LowerRightCorner.X = iVar5;
      rectangle_02.LowerRightCorner.Y = in_stack_fffffffffffffeb4;
      CGUIButton::CGUIButton
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (s32)((ulong)in_stack_fffffffffffffe88 >> 0x20),rectangle_02,
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      in_RDI[0x28] = (long)in_stack_fffffffffffffe78;
      (**(code **)(*(long *)in_RDI[0x28] + 0x88))();
      IGUIElement::setTabStop((IGUIElement *)in_RDI[0x28],false);
    }
    if (local_20 != 0) {
      (**(code **)(*(long *)in_RDI[0x28] + 0x188))((long *)in_RDI[0x28],local_20);
      plVar1 = (long *)in_RDI[0x28];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,6);
      (**(code **)(*plVar1 + 400))(plVar1,0,uVar3,(int)in_RDI[0x30],0);
      plVar1 = (long *)in_RDI[0x28];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,6);
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,(int)in_RDI[0x30],0);
    }
    this_00 = (rect<int> *)in_RDI[0x28];
    iVar5 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
    iVar5 = iVar5 - iVar4;
    core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
    core::rect<int>::rect(this_00,x,iVar5,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
    IGUIElement::setRelativePosition(this_01,in_stack_fffffffffffffe78);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe78,
               (EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe70);
  }
  else {
    iVar4 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 6));
    iVar5 = core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
    if (iVar5 / 2 <= iVar4) {
      core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
    }
    if (in_RDI[0x27] == 0) {
      pvVar9 = operator_new(0x2a8);
      core::rect<int>::rect
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      rectangle.UpperLeftCorner.Y = in_stack_fffffffffffffeac;
      rectangle.UpperLeftCorner.X = in_stack_fffffffffffffea8;
      rectangle.LowerRightCorner.X = in_stack_fffffffffffffeb0;
      rectangle.LowerRightCorner.Y = in_stack_fffffffffffffeb4;
      CGUIButton::CGUIButton
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (s32)((ulong)in_stack_fffffffffffffe88 >> 0x20),rectangle,
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      in_RDI[0x27] = (long)pvVar9;
      (**(code **)(*(long *)in_RDI[0x27] + 0x88))();
      IGUIElement::setTabStop((IGUIElement *)in_RDI[0x27],false);
    }
    if (local_20 != 0) {
      (**(code **)(*(long *)in_RDI[0x27] + 0x188))((long *)in_RDI[0x27],local_20);
      plVar1 = (long *)in_RDI[0x27];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,7);
      (**(code **)(*plVar1 + 400))(plVar1,0,uVar3,(int)in_RDI[0x30],0);
      plVar1 = (long *)in_RDI[0x27];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,7);
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,(int)in_RDI[0x30],0);
    }
    core::rect<int>::rect
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
    IGUIElement::setRelativePosition(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    IGUIElement::setAlignment
              (in_stack_fffffffffffffe80,(EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe78,
               (EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe70);
    if (in_RDI[0x28] == 0) {
      pvVar9 = operator_new(0x2a8);
      core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
      core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
      core::rect<int>::rect
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      rectangle_00.UpperLeftCorner.Y = in_stack_fffffffffffffeac;
      rectangle_00.UpperLeftCorner.X = in_stack_fffffffffffffea8;
      rectangle_00.LowerRightCorner.X = in_stack_fffffffffffffeb0;
      rectangle_00.LowerRightCorner.Y = in_stack_fffffffffffffeb4;
      CGUIButton::CGUIButton
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (s32)((ulong)in_stack_fffffffffffffe88 >> 0x20),rectangle_00,
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      in_RDI[0x28] = (long)pvVar9;
      (**(code **)(*(long *)in_RDI[0x28] + 0x88))();
      IGUIElement::setTabStop((IGUIElement *)in_RDI[0x28],false);
    }
    if (local_20 != 0) {
      (**(code **)(*(long *)in_RDI[0x28] + 0x188))((long *)in_RDI[0x28],local_20);
      plVar1 = (long *)in_RDI[0x28];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,8);
      (**(code **)(*plVar1 + 400))(plVar1,0,uVar3,(int)in_RDI[0x30],0);
      plVar1 = (long *)in_RDI[0x28];
      uVar3 = (**(code **)(*plVar8 + 0x50))(plVar8,8);
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,(int)in_RDI[0x30],0);
    }
    core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
    core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
    core::rect<int>::rect
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
    IGUIElement::setRelativePosition(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    IGUIElement::setAlignment
              (in_stack_fffffffffffffe80,(EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe78,
               (EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void CGUIScrollBar::refreshControls()
{
	CurrentIconColor = video::SColor(255, 255, 255, 255);

	IGUISkin *skin = Environment->getSkin();
	IGUISpriteBank *sprites = 0;

	if (skin) {
		sprites = skin->getSpriteBank();
		CurrentIconColor = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);
	}

	if (Horizontal) {
		const s32 h = RelativeRect.getHeight();
		const s32 w = (h < RelativeRect.getWidth() / 2) ? h : RelativeRect.getWidth() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h));
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	} else {
		const s32 w = RelativeRect.getWidth();
		const s32 h = (w < RelativeRect.getHeight() / 2) ? w : RelativeRect.getHeight() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()));
		DownButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}
}